

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simultan.c
# Opt level: O0

int in_solvefor(Symbol *s)

{
  Item *q;
  Symbol *s_local;
  int local_4;
  
  if (solveforlist == (List *)0x0) {
    local_4 = 1;
  }
  else {
    for (q = solveforlist->next; q != solveforlist; q = q->next) {
      if (s == (Symbol *)(q->element).itm) {
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int in_solvefor(s)
	Symbol *s;
{
	Item *q;
	
	if (!solveforlist) {
		return 1;
	}
	ITERATE(q, solveforlist) {
		if (s == SYM(q)) {
			return 1;
		}
	}
	return 0;
}